

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void bfstages(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  float *local_128;
  ulong local_120;
  ulong local_118;
  float *local_110;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  long local_d0;
  ulong local_c8;
  float *local_a8;
  float *local_a0;
  float *local_98;
  
  if (0 < StageCnt) {
    auVar47._8_4_ = 0x80000000;
    auVar47._0_8_ = 0x8000000080000000;
    auVar47._12_4_ = 0x80000000;
    lVar19 = NDiffU * 2;
    uVar12 = (ulong)(1L << (M & 0x3fU)) >> 3;
    local_c8 = uVar12 / (ulong)NDiffU;
    local_d0 = NDiffU << 4;
    lVar16 = uVar12 * Ustride;
    local_118 = local_c8 * Ustride;
    local_120 = local_118 * 2;
    pfVar1 = Utbl + (Ustride << ((ulong)(byte)((char)M - 2) & 0x3f));
    lVar17 = NDiffU;
    do {
      if (NDiffU != 0) {
        lVar2 = lVar17 * 8 + 1;
        lVar20 = local_118 * 4;
        fVar3 = *pfVar1;
        fVar4 = *Utbl;
        fVar5 = pfVar1[-lVar16];
        uVar18 = NDiffU / 2;
        fVar6 = Utbl[lVar16];
        auVar50 = ZEXT1664(ZEXT416((uint)fVar3));
        auVar41 = ZEXT416((uint)fVar4);
        auVar52 = ZEXT1664(auVar41);
        auVar51 = ZEXT1664(ZEXT416((uint)fVar3));
        uVar12 = NDiffU;
        pfVar14 = ioptr;
        pfVar21 = Utbl;
        local_110 = pfVar1;
        local_f8 = pfVar1;
        local_f0 = Utbl;
        local_a0 = Utbl;
        local_98 = pfVar1;
        do {
          fVar7 = *pfVar14;
          fVar8 = pfVar14[1];
          fVar9 = pfVar14[lVar19];
          fVar10 = pfVar14[lVar19 + 1];
          auVar46 = SUB6416(ZEXT464(0x40000000),0);
          auVar44 = ZEXT416((uint)fVar4);
          auVar43 = ZEXT416((uint)fVar3);
          auVar48 = ZEXT416((uint)fVar6);
          auVar49 = ZEXT416((uint)fVar5);
          auVar40 = auVar51._0_16_;
          auVar42 = auVar52._0_16_;
          auVar45 = auVar50._0_16_;
          lVar13 = local_c8 - 1;
          pfVar15 = pfVar14;
          if (local_c8 - 1 == 0) {
            local_e8 = pfVar14 + lVar19;
            local_a8 = local_e8 + lVar19;
            local_128 = local_a8 + lVar19;
          }
          else {
            do {
              auVar22 = vfmadd213ss_fma(auVar41,ZEXT416((uint)fVar9),ZEXT416((uint)fVar7));
              auVar29 = vfmsub213ss_fma(ZEXT416((uint)fVar9),auVar40,ZEXT416((uint)fVar8));
              lVar13 = lVar13 + -1;
              auVar33 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar10),auVar40);
              auVar34 = vfmsub231ss_fma(auVar29,auVar41,ZEXT416((uint)fVar10));
              auVar22 = vmulss_avx512f(auVar40,ZEXT416((uint)pfVar15[lVar19 * 3 + 1]));
              auVar29 = vfmsub213ss_fma(ZEXT416((uint)fVar7),auVar46,auVar33);
              auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar8),auVar46,auVar34);
              auVar22 = vfnmsub231ss_avx512f(auVar22,ZEXT416((uint)pfVar15[lVar19 * 3]),auVar41);
              auVar23 = vfmadd213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 3]),auVar40,
                                            ZEXT416((uint)pfVar15[lVar19 * 2 + 1]));
              auVar22 = vaddss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 2]),auVar22);
              auVar23 = vfnmadd231ss_avx512f(auVar23,auVar41,ZEXT416((uint)pfVar15[lVar19 * 3 + 1]))
              ;
              auVar24 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 2]),auVar46,auVar22);
              auVar25 = vfmadd213ss_avx512f(auVar45,auVar22,auVar29);
              auVar22 = vfmadd213ss_fma(auVar22,auVar42,auVar39);
              auVar26 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 2 + 1]),auVar46,auVar23);
              auVar27 = vfmadd213ss_avx512f(auVar42,auVar24,auVar33);
              auVar24 = vfmsub213ss_avx512f(auVar24,auVar45,auVar34);
              auVar25 = vfnmadd231ss_avx512f(auVar25,auVar42,auVar23);
              auVar23 = vfmadd231ss_avx512f(auVar22,auVar45,auVar23);
              auVar22 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)pfVar15[lVar19 + lVar17 * 8]),
                                            ZEXT416((uint)pfVar15[lVar17 * 8]));
              auVar28 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 + lVar17 * 8]),auVar40,
                                            ZEXT416((uint)pfVar15[lVar17 * 8 + 1]));
              auVar27 = vfmadd231ss_avx512f(auVar27,auVar26,auVar45);
              auVar24 = vfmsub231ss_avx512f(auVar24,auVar42,auVar26);
              auVar26 = vmulss_avx512f(auVar40,ZEXT416((uint)pfVar15[lVar19 * 3 + lVar17 * 8 + 1]));
              auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)pfVar15[lVar19 + lVar17 * 8 + 1]),
                                            auVar40);
              auVar28 = vfmsub231ss_avx512f(auVar28,auVar41,
                                            ZEXT416((uint)pfVar15[lVar19 + lVar17 * 8 + 1]));
              auVar39 = vfmsub213ss_fma(auVar39,auVar46,auVar23);
              auVar29 = vfmsub213ss_avx512f(auVar29,auVar46,auVar25);
              auVar26 = vfnmsub231ss_avx512f
                                  (auVar26,ZEXT416((uint)pfVar15[lVar19 * 3 + lVar17 * 8]),auVar41);
              auVar30 = vfmadd213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 3 + lVar17 * 8]),auVar40,
                                            ZEXT416((uint)pfVar15[lVar19 * 2 + lVar17 * 8 + 1]));
              auVar31 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar17 * 8]),auVar46,auVar22);
              auVar32 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar17 * 8 + 1]),auVar46,auVar28);
              auVar33 = vfmsub213ss_avx512f(auVar33,auVar46,auVar27);
              auVar34 = vfmsub213ss_avx512f(auVar34,auVar46,auVar24);
              auVar26 = vaddss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 2 + lVar17 * 8]),auVar26);
              auVar30 = vfnmadd231ss_avx512f
                                  (auVar30,auVar41,
                                   ZEXT416((uint)pfVar15[lVar19 * 3 + lVar17 * 8 + 1]));
              auVar35 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 2 + lVar17 * 8]),auVar46,
                                            auVar26);
              auVar36 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar19 * 2 + lVar17 * 8 + 1]),
                                            auVar46,auVar30);
              auVar37 = vfmadd213ss_avx512f(auVar42,auVar35,auVar22);
              auVar35 = vfmsub213ss_avx512f(auVar35,auVar45,auVar28);
              auVar37 = vfmadd231ss_avx512f(auVar37,auVar36,auVar45);
              auVar35 = vfmsub231ss_avx512f(auVar35,auVar42,auVar36);
              auVar36 = vfmadd213ss_avx512f(auVar45,auVar26,auVar31);
              auVar26 = vfmadd213ss_avx512f(auVar26,auVar42,auVar32);
              auVar36 = vfnmadd231ss_avx512f(auVar36,auVar42,auVar30);
              auVar26 = vfmadd231ss_avx512f(auVar26,auVar45,auVar30);
              auVar30 = vmulss_avx512f(ZEXT416((uint)fVar4),auVar37);
              auVar38 = vfmsub213ss_avx512f(auVar22,auVar46,auVar37);
              auVar22 = vfmadd213ss_avx512f(auVar37,ZEXT416((uint)fVar3),auVar24);
              auVar28 = vfmsub213ss_avx512f(auVar28,auVar46,auVar35);
              auVar30 = vfnmsub231ss_avx512f(auVar30,auVar35,ZEXT416((uint)fVar3));
              auVar31 = vfmsub213ss_avx512f(auVar31,auVar46,auVar36);
              auVar32 = vfmsub213ss_avx512f(auVar32,auVar46,auVar26);
              auVar35 = vfnmadd231ss_avx512f(auVar22,ZEXT416((uint)fVar4),auVar35);
              auVar30 = vaddss_avx512f(auVar27,auVar30);
              auVar37 = vmulss_avx512f(ZEXT416((uint)fVar6),auVar31);
              auVar22 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar5),auVar39);
              auVar24 = vfmsub213ss_avx512f(auVar24,auVar46,auVar35);
              auVar27 = vfmsub213ss_avx512f(auVar27,auVar46,auVar30);
              pfVar15[lVar17 * 8] = auVar30._0_4_;
              auVar30 = vfnmsub231ss_avx512f(auVar37,auVar32,ZEXT416((uint)fVar5));
              auVar31 = vfnmadd231ss_avx512f(auVar22,ZEXT416((uint)fVar6),auVar32);
              auVar22 = vmulss_avx512f(auVar44,auVar38);
              auVar30 = vaddss_avx512f(auVar29,auVar30);
              auVar32 = vfnmsub231ss_avx512f(auVar22,auVar43,auVar28);
              auVar22 = vfmsub213ss_fma(auVar39,auVar46,auVar31);
              auVar29 = vfmsub213ss_avx512f(auVar29,auVar46,auVar30);
              pfVar15[lVar19 + lVar17 * 8] = auVar30._0_4_;
              pfVar15[lVar17 * 8 + 1] = auVar35._0_4_;
              pfVar15[lVar19 + lVar17 * 8 + 1] = auVar31._0_4_;
              *pfVar15 = auVar27._0_4_;
              auVar39 = vmulss_avx512f(auVar48,auVar36);
              auVar27 = vaddss_avx512f(auVar34,auVar32);
              auVar30 = vfmsub213ss_avx512f(auVar49,auVar36,auVar25);
              auVar39 = vfnmsub231ss_avx512f(auVar39,auVar49,auVar26);
              pfVar15[lVar19] = auVar29._0_4_;
              pfVar15[1] = auVar24._0_4_;
              auVar29 = vfmsub213ss_avx512f(auVar43,auVar38,auVar33);
              pfVar15[lVar19 + 1] = auVar22._0_4_;
              auVar22 = vfmsub213ss_avx512f(auVar34,auVar46,auVar27);
              auVar34 = vfmsub231ss_avx512f(auVar30,auVar26,auVar48);
              fVar7 = pfVar15[local_d0];
              fVar8 = pfVar15[local_d0 + 1];
              fVar9 = pfVar15[lVar19 + local_d0];
              fVar10 = pfVar15[lVar19 + local_d0 + 1];
              auVar39 = vaddss_avx512f(auVar23,auVar39);
              auVar29 = vfmsub231ss_avx512f(auVar29,auVar28,auVar44);
              auVar24 = vfmsub213ss_avx512f(auVar25,auVar46,auVar34);
              auVar23 = vfmsub213ss_avx512f(auVar23,auVar46,auVar39);
              auVar33 = vfmsub213ss_avx512f(auVar33,auVar46,auVar29);
              pfVar15[lVar19 * 2] = auVar29._0_4_;
              pfVar15[lVar19 * 3] = auVar34._0_4_;
              pfVar15[lVar19 * 2 + 1] = auVar27._0_4_;
              pfVar15[lVar19 * 3 + 1] = auVar39._0_4_;
              pfVar15[lVar19 * 2 + lVar17 * 8] = auVar33._0_4_;
              pfVar15[lVar19 * 3 + lVar17 * 8] = auVar24._0_4_;
              pfVar15[lVar19 * 2 + lVar17 * 8 + 1] = auVar22._0_4_;
              pfVar15[lVar19 * 3 + lVar17 * 8 + 1] = auVar23._0_4_;
              pfVar15 = pfVar15 + local_d0;
            } while (lVar13 != 0);
            local_128 = pfVar15 + lVar19 * 3;
            local_a8 = pfVar15 + lVar19 * 2;
            local_e8 = pfVar15 + lVar19;
          }
          auVar33 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)fVar9),ZEXT416((uint)fVar7));
          auVar22 = vfmsub213ss_fma(ZEXT416((uint)fVar9),auVar40,ZEXT416((uint)fVar8));
          auVar33 = vfmadd231ss_avx512f(auVar33,ZEXT416((uint)fVar10),auVar40);
          auVar22 = vfmsub231ss_fma(auVar22,auVar41,ZEXT416((uint)fVar10));
          if (uVar12 == uVar18) {
            lVar20 = -lVar20;
          }
          auVar34 = vfmsub213ss_avx512f(ZEXT416((uint)fVar7),auVar46,auVar33);
          auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar8),auVar46,auVar22);
          local_110 = local_110 + -lVar20;
          auVar29 = vmulss_avx512f(ZEXT416((uint)local_128[1]),auVar40);
          local_a0 = local_a0 + lVar20;
          auVar29 = vfnmsub231ss_avx512f(auVar29,ZEXT416((uint)*local_128),auVar41);
          auVar23 = vfmadd213ss_avx512f(ZEXT416((uint)*local_128),auVar40,ZEXT416((uint)local_a8[1])
                                       );
          auVar24 = vfmadd213ss_avx512f(auVar41,ZEXT416((uint)local_e8[lVar17 * 8]),
                                        ZEXT416((uint)pfVar15[lVar17 * 8]));
          auVar25 = vfmsub213ss_avx512f(ZEXT416((uint)local_e8[lVar17 * 8]),auVar40,
                                        ZEXT416((uint)pfVar15[lVar2]));
          auVar29 = vaddss_avx512f(ZEXT416((uint)*local_a8),auVar29);
          auVar23 = vfnmadd231ss_avx512f(auVar23,auVar41,ZEXT416((uint)local_128[1]));
          local_f0 = local_f0 + local_120;
          fVar5 = *local_a0;
          auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)local_e8[lVar2]),auVar40);
          auVar25 = vfmsub231ss_avx512f(auVar25,auVar41,ZEXT416((uint)local_e8[lVar2]));
          auVar26 = vfmsub213ss_avx512f(ZEXT416((uint)*local_a8),auVar46,auVar29);
          auVar27 = vfmsub213ss_avx512f(ZEXT416((uint)local_a8[1]),auVar46,auVar23);
          local_98 = local_98 + -local_120;
          auVar28 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar17 * 8]),auVar46,auVar24);
          auVar30 = vfmsub213ss_avx512f(ZEXT416((uint)pfVar15[lVar2]),auVar46,auVar25);
          auVar31 = vfmadd213ss_avx512f(auVar42,auVar26,auVar33);
          auVar26 = vfmsub213ss_avx512f(auVar26,auVar45,auVar22);
          pfVar21 = pfVar21 + local_118;
          auVar31 = vfmadd231ss_avx512f(auVar31,auVar27,auVar45);
          auVar26 = vfmsub231ss_avx512f(auVar26,auVar42,auVar27);
          auVar27 = vfmadd213ss_avx512f(auVar45,auVar29,auVar34);
          auVar29 = vfmadd213ss_fma(auVar29,auVar42,auVar39);
          auVar27 = vfnmadd231ss_avx512f(auVar27,auVar23,auVar42);
          auVar29 = vfmadd231ss_avx512f(auVar29,auVar45,auVar23);
          auVar23 = vmulss_avx512f(ZEXT416((uint)local_128[lVar2]),auVar40);
          auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)local_128[lVar17 * 8]),
                                        ZEXT416((uint)local_a8[lVar2]));
          auVar33 = vfmsub213ss_avx512f(auVar33,auVar46,auVar31);
          auVar32 = vfmsub213ss_avx512f(auVar22,auVar46,auVar26);
          local_f8 = local_f8 + -local_118;
          auVar22 = vfnmsub231ss_avx512f(auVar23,ZEXT416((uint)local_128[lVar17 * 8]),auVar41);
          auVar23 = vfnmadd231ss_avx512f(auVar40,ZEXT416((uint)local_128[lVar2]),auVar41);
          auVar40 = vfmsub213ss_fma(auVar39,auVar46,auVar29);
          auVar39 = vfmsub213ss_avx512f(auVar34,auVar46,auVar27);
          auVar41 = vaddss_avx512f(ZEXT416((uint)local_a8[lVar17 * 8]),auVar22);
          auVar34 = vfmsub213ss_avx512f(ZEXT416((uint)local_a8[lVar2]),auVar46,auVar23);
          auVar22 = vfmsub213ss_avx512f(ZEXT416((uint)local_a8[lVar17 * 8]),auVar46,auVar41);
          auVar35 = vfmadd213ss_avx512f(auVar45,auVar41,auVar28);
          auVar36 = vfmadd213ss_avx512f(auVar42,auVar22,auVar24);
          auVar37 = vfmsub213ss_avx512f(auVar22,auVar45,auVar25);
          auVar22 = vfnmadd231ss_fma(auVar35,auVar23,auVar42);
          auVar35 = vfmadd231ss_avx512f(auVar36,auVar34,auVar45);
          auVar34 = vfmsub231ss_avx512f(auVar37,auVar42,auVar34);
          auVar42 = vfmadd213ss_avx512f(auVar42,auVar41,auVar30);
          auVar41 = vfmsub213ss_fma(auVar28,auVar46,auVar22);
          auVar24 = vfmsub213ss_avx512f(auVar24,auVar46,auVar35);
          auVar25 = vfmsub213ss_avx512f(auVar25,auVar46,auVar34);
          auVar28 = vmulss_avx512f(auVar35,auVar44);
          auVar35 = vfmadd213ss_avx512f(auVar35,auVar43,auVar26);
          auVar45 = vfmadd231ss_fma(auVar42,auVar45,auVar23);
          auVar51 = ZEXT464((uint)*local_110);
          auVar50 = ZEXT464((uint)*local_98);
          auVar23 = vfnmsub231ss_avx512f(auVar28,auVar34,auVar43);
          auVar28 = vmulss_avx512f(auVar24,auVar44);
          auVar34 = vfnmadd231ss_avx512f(auVar35,auVar44,auVar34);
          auVar42 = vfmsub213ss_fma(auVar30,auVar46,auVar45);
          fVar6 = *local_f0;
          auVar28 = vfnmsub231ss_avx512f(auVar28,auVar43,auVar25);
          auVar43 = vfmsub213ss_avx512f(auVar43,auVar24,auVar33);
          auVar23 = vaddss_avx512f(auVar31,auVar23);
          auVar24 = vfmsub213ss_avx512f(auVar26,auVar46,auVar34);
          auVar26 = vfmsub213ss_avx512f(auVar31,auVar46,auVar23);
          pfVar15[lVar17 * 8] = auVar23._0_4_;
          auVar44 = vfmsub231ss_avx512f(auVar43,auVar25,auVar44);
          auVar43 = vaddss_avx512f(auVar32,auVar28);
          auVar23 = vfmsub213ss_avx512f(auVar32,auVar46,auVar43);
          auVar33 = vfmsub213ss_avx512f(auVar33,auVar46,auVar44);
          *local_a8 = auVar44._0_4_;
          pfVar15[lVar2] = auVar34._0_4_;
          local_a8[1] = auVar43._0_4_;
          fVar3 = *local_f8;
          fVar4 = *pfVar21;
          *pfVar15 = auVar26._0_4_;
          local_a8[lVar17 * 8] = auVar33._0_4_;
          pfVar15[1] = auVar24._0_4_;
          auVar44 = vmulss_avx512f(auVar41,auVar48);
          auVar43 = vmulss_avx512f(auVar22,auVar48);
          auVar41 = vfmadd213ss_fma(auVar41,auVar49,auVar40);
          local_a8[lVar2] = auVar23._0_4_;
          auVar43 = vfnmsub231ss_avx512f(auVar43,auVar49,auVar45);
          auVar44 = vfnmsub231ss_avx512f(auVar44,auVar42,auVar49);
          auVar22 = vfmsub213ss_avx512f(auVar49,auVar22,auVar27);
          auVar49 = vfnmadd231ss_fma(auVar41,auVar48,auVar42);
          auVar41 = vfmsub231ss_fma(auVar22,auVar45,auVar48);
          auVar44 = vaddss_avx512f(auVar39,auVar44);
          auVar45 = vaddss_avx512f(auVar29,auVar43);
          auVar48 = vfmsub213ss_fma(auVar40,auVar46,auVar49);
          local_e8[lVar17 * 8] = auVar44._0_4_;
          auVar44 = vfmsub213ss_fma(auVar39,auVar46,auVar44);
          auVar43 = vfmsub213ss_fma(auVar29,auVar46,auVar45);
          auVar52 = ZEXT464((uint)fVar6);
          *local_128 = auVar41._0_4_;
          local_e8[lVar2] = auVar49._0_4_;
          local_128[1] = auVar45._0_4_;
          auVar46 = vfmsub213ss_avx512f(auVar27,auVar46,auVar41);
          auVar41 = vxorps_avx512vl(ZEXT416((uint)fVar5),auVar47);
          fVar6 = pfVar21[lVar16];
          auVar41._0_4_ =
               (uint)(uVar18 < uVar12) * (int)fVar5 + (uint)(uVar12 <= uVar18) * auVar41._0_4_;
          fVar5 = local_f8[-lVar16];
          *local_e8 = auVar44._0_4_;
          local_128[lVar17 * 8] = auVar46._0_4_;
          local_e8[1] = auVar48._0_4_;
          local_128[lVar2] = auVar43._0_4_;
          pfVar14 = pfVar14 + 2;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      local_c8 = local_c8 >> 3;
      local_118 = local_118 >> 3;
      local_120 = local_120 >> 3;
      local_d0 = local_d0 << 3;
      lVar19 = lVar19 << 3;
      NDiffU = NDiffU << 3;
      bVar11 = 1 < StageCnt;
      lVar17 = lVar17 * 8;
      StageCnt = StageCnt + -1;
    } while (bVar11);
  }
  return;
}

Assistant:

static inline void bfstages(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt) {
/***   RADIX 8 Stages	***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long 	NSameU;
unsigned long 	Uinc;
unsigned long 	Uinc2;
unsigned long 	Uinc4;
unsigned long 	DiffUCnt;
unsigned long 	SameUCnt;
unsigned long 	U2toU3;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;
float 	*u0r, *u0i, *u1r, *u1i, *u2r, *u2i;

float w0r, w0i, w1r, w1i, w2r, w2i, w3r, w3i;
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 8;
pos = pinc * 4;
posi =  pos + 1;
NSameU = POW2(M) / 8 /NDiffU;	// 8 pts per butterfly
Uinc = NSameU * Ustride;
Uinc2 = Uinc * 2;
Uinc4 = Uinc * 4;
U2toU3 = (POW2(M) / 8)*Ustride;
for (; StageCnt > 0 ; StageCnt--){

	u0r = &Utbl[0];
	u0i = &Utbl[POW2(M-2)*Ustride];
	u1r = u0r;
	u1i = u0i;
	u2r = u0r;
	u2i = u0i;

	w0r =  *u0r;
	w0i =  *u0i;
	w1r =  *u1r;
	w1i =  *u1i;
	w2r =  *u2r;
	w2i =  *u2i;
	w3r =  *(u2r+U2toU3);
	w3i =  *(u2i-U2toU3);

	pstrt = ioptr;

	p0r = pstrt;
	p1r = pstrt+pinc;
	p2r = p1r+pinc;
	p3r = p2r+pinc;

			/* Butterflys		*/
			/*
			f0	-	-	t0	-	-	f0	-	-	f0
			f1	- w0-	f1	-	-	f1	-	-	f1
			f2	-	-	f2	- w1-	f2	-	-	f4
			f3	- w0-	t1	- iw1-	f3	-	-	f5

			f4	-	-	t0	-	-	f4	- w2-	t0
			f5	- w0-	f5	-	-	f5	- w3-	t1
			f6	-	-	f6	- w1-	f6	- iw2-	f6
			f7	- w0-	t1	- iw1-	f7	- iw3-	f7
			*/

	for (DiffUCnt = NDiffU; DiffUCnt > 0 ; DiffUCnt--){
		f0r = *p0r;
		f0i = *(p0r + 1);
		f1r = *p1r;
		f1i = *(p1r + 1);
		for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){
			f2r = *p2r;
			f2i = *(p2r + 1);
			f3r = *p3r;
			f3i = *(p3r + 1);

			t0r = f0r + f1r * w0r + f1i * w0i;
			t0i = f0i - f1r * w0i + f1i * w0r;
			f1r = f0r * Two - t0r;
			f1i = f0i * Two - t0i;

			f4r = *(p0r + pos);
			f4i = *(p0r + posi);
			f5r = *(p1r + pos);
			f5i = *(p1r + posi);

			f6r = *(p2r + pos);
			f6i = *(p2r + posi);
			f7r = *(p3r + pos);
			f7i = *(p3r + posi);

			t1r = f2r - f3r * w0r - f3i * w0i;
			t1i = f2i + f3r * w0i - f3i * w0r;
			f2r = f2r * Two - t1r;
			f2i = f2i * Two - t1i;

			f0r = t0r + f2r * w1r + f2i * w1i;
			f0i = t0i - f2r * w1i + f2i * w1r;
			f2r = t0r * Two - f0r;
			f2i = t0i * Two - f0i;

			f3r = f1r + t1r * w1i - t1i * w1r;
			f3i = f1i + t1r * w1r + t1i * w1i;
			f1r = f1r * Two - f3r;
			f1i = f1i * Two - f3i;


			t0r = f4r + f5r * w0r + f5i * w0i;
			t0i = f4i - f5r * w0i + f5i * w0r;
			f5r = f4r * Two - t0r;
			f5i = f4i * Two - t0i;

			t1r = f6r - f7r * w0r - f7i * w0i;
			t1i = f6i + f7r * w0i - f7i * w0r;
			f6r = f6r * Two - t1r;
			f6i = f6i * Two - t1i;

			f4r = t0r + f6r * w1r + f6i * w1i;
			f4i = t0i - f6r * w1i + f6i * w1r;
			f6r = t0r * Two - f4r;
			f6i = t0i * Two - f4i;

			f7r = f5r + t1r * w1i - t1i * w1r;
			f7i = f5i + t1r * w1r + t1i * w1i;
			f5r = f5r * Two - f7r;
			f5i = f5i * Two - f7i;

			t0r = f0r - f4r * w2r - f4i * w2i;
			t0i = f0i + f4r * w2i - f4i * w2r;
			f0r = f0r * Two - t0r;
			f0i = f0i * Two - t0i;

			t1r = f1r - f5r * w3r - f5i * w3i;
			t1i = f1i + f5r * w3i - f5i * w3r;
			f1r = f1r * Two - t1r;
			f1i = f1i * Two - t1i;

			*(p0r + pos) = t0r;
			*(p1r + pos) = t1r;
			*(p0r + posi) = t0i;
			*(p1r + posi) = t1i;
			*p0r = f0r;
			*p1r = f1r;
			*(p0r + 1) = f0i;
			*(p1r + 1) = f1i;

			p0r += pnext;
			f0r = *p0r;
			f0i = *(p0r + 1);

			p1r += pnext;

			f1r = *p1r;
			f1i = *(p1r + 1);

			f4r = f2r - f6r * w2i + f6i * w2r;
			f4i = f2i - f6r * w2r - f6i * w2i;
			f6r = f2r * Two - f4r;
			f6i = f2i * Two - f4i;

			f5r = f3r - f7r * w3i + f7i * w3r;
			f5i = f3i - f7r * w3r - f7i * w3i;
			f7r = f3r * Two - f5r;
			f7i = f3i * Two - f5i;

			*p2r = f4r;
			*p3r = f5r;
			*(p2r + 1) = f4i;
			*(p3r + 1) = f5i;
			*(p2r + pos) = f6r;
			*(p3r + pos) = f7r;
			*(p2r + posi) = f6i;
			*(p3r + posi) = f7i;

			p2r += pnext;
			p3r += pnext;

		}
		
		f2r = *p2r;
		f2i = *(p2r + 1);
		f3r = *p3r;
		f3i = *(p3r + 1);

		t0r = f0r + f1r * w0r + f1i * w0i;
		t0i = f0i - f1r * w0i + f1i * w0r;
		f1r = f0r * Two - t0r;
		f1i = f0i * Two - t0i;

		f4r = *(p0r + pos);
		f4i = *(p0r + posi);
		f5r = *(p1r + pos);
		f5i = *(p1r + posi);

		f6r = *(p2r + pos);
		f6i = *(p2r + posi);
		f7r = *(p3r + pos);
		f7i = *(p3r + posi);

		t1r = f2r - f3r * w0r - f3i * w0i;
		t1i = f2i + f3r * w0i - f3i * w0r;
		f2r = f2r * Two - t1r;
		f2i = f2i * Two - t1i;

		f0r = t0r + f2r * w1r + f2i * w1i;
		f0i = t0i - f2r * w1i + f2i * w1r;
		f2r = t0r * Two - f0r;
		f2i = t0i * Two - f0i;

		f3r = f1r + t1r * w1i - t1i * w1r;
		f3i = f1i + t1r * w1r + t1i * w1i;
		f1r = f1r * Two - f3r;
		f1i = f1i * Two - f3i;

		if (DiffUCnt == NDiffU/2)
			Uinc4 = -Uinc4;

		u0r += Uinc4;
		u0i -= Uinc4;
		u1r += Uinc2;
		u1i -= Uinc2;
		u2r += Uinc;
		u2i -= Uinc;

		pstrt += 2;

		t0r = f4r + f5r * w0r + f5i * w0i;
		t0i = f4i - f5r * w0i + f5i * w0r;
		f5r = f4r * Two - t0r;
		f5i = f4i * Two - t0i;

		t1r = f6r - f7r * w0r - f7i * w0i;
		t1i = f6i + f7r * w0i - f7i * w0r;
		f6r = f6r * Two - t1r;
		f6i = f6i * Two - t1i;

		f4r = t0r + f6r * w1r + f6i * w1i;
		f4i = t0i - f6r * w1i + f6i * w1r;
		f6r = t0r * Two - f4r;
		f6i = t0i * Two - f4i;

		f7r = f5r + t1r * w1i - t1i * w1r;
		f7i = f5i + t1r * w1r + t1i * w1i;
		f5r = f5r * Two - f7r;
		f5i = f5i * Two - f7i;

		w0r = *u0r;
		w0i =  *u0i;
		w1r =  *u1r;
		w1i =  *u1i;

		if (DiffUCnt <= NDiffU/2)
			w0r = -w0r;

		t0r = f0r - f4r * w2r - f4i * w2i;
		t0i = f0i + f4r * w2i - f4i * w2r;
		f0r = f0r * Two - t0r;
		f0i = f0i * Two - t0i;

		f4r = f2r - f6r * w2i + f6i * w2r;
		f4i = f2i - f6r * w2r - f6i * w2i;
		f6r = f2r * Two - f4r;
		f6i = f2i * Two - f4i;

		*(p0r + pos) = t0r;
		*p2r = f4r;
		*(p0r + posi) = t0i;
		*(p2r + 1) = f4i;
		w2r =  *u2r;
		w2i =  *u2i;
		*p0r = f0r;
		*(p2r + pos) = f6r;
		*(p0r + 1) = f0i;
		*(p2r + posi) = f6i;

		p0r = pstrt;
		p2r = pstrt + pinc + pinc;	

		t1r = f1r - f5r * w3r - f5i * w3i;
		t1i = f1i + f5r * w3i - f5i * w3r;
		f1r = f1r * Two - t1r;
		f1i = f1i * Two - t1i;

		f5r = f3r - f7r * w3i + f7i * w3r;
		f5i = f3i - f7r * w3r - f7i * w3i;
		f7r = f3r * Two - f5r;
		f7i = f3i * Two - f5i;

		*(p1r + pos) = t1r;
		*p3r = f5r;
		*(p1r + posi) = t1i;
		*(p3r + 1) = f5i;
		w3r =  *(u2r+U2toU3);
		w3i =  *(u2i-U2toU3);
		*p1r = f1r;
		*(p3r + pos) = f7r;
		*(p1r + 1) = f1i;
		*(p3r + posi) = f7i;

		p1r = pstrt + pinc;
		p3r = p2r + pinc;	
	}
	NSameU /= 8;
	Uinc /= 8;
	Uinc2 /= 8;
	Uinc4 = Uinc * 4;
	NDiffU *= 8;
	pinc *= 8;
	pnext *= 8;
	pos *= 8;
	posi =  pos + 1;
}
}